

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O3

void Abc_QuickSort3Inc_rec(word *pData,int l,int r)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  word *pwVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  word *pwVar8;
  int l_00;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  word t;
  word wVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int local_5c;
  uint local_58;
  
  uVar7 = (ulong)(uint)l;
  if (l < r) {
    lVar16 = (long)r;
    do {
      l_00 = (int)uVar7;
      uVar1 = r - l_00;
      if ((int)uVar1 < 10) {
        if ((int)uVar1 < 1) {
          return;
        }
        uVar11 = 1;
        uVar7 = 0;
        do {
          uVar12 = uVar7 & 0xffffffff;
          uVar15 = uVar11;
          do {
            uVar10 = (uint)uVar15;
            if ((uint)pData[(long)l_00 + (long)(int)(uint)uVar12] <=
                (uint)pData[(long)l_00 + uVar15]) {
              uVar10 = (uint)uVar12;
            }
            uVar15 = uVar15 + 1;
            uVar12 = (ulong)uVar10;
          } while (uVar1 + 1 != uVar15);
          wVar14 = pData[(long)l_00 + uVar7];
          pData[(long)l_00 + uVar7] = pData[(long)l_00 + (long)(int)uVar10];
          uVar7 = uVar7 + 1;
          pData[(long)l_00 + (long)(int)uVar10] = wVar14;
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar1);
        return;
      }
      local_58 = l_00 - 1;
      uVar1 = (uint)pData[lVar16];
      uVar11 = (ulong)(uint)r;
      uVar7 = (ulong)local_58;
      local_5c = r;
LAB_0049cc08:
      iVar5 = (int)uVar7;
      lVar17 = (long)iVar5;
      lVar3 = 0;
      pwVar4 = pData + lVar17;
      uVar10 = iVar5 + 2;
      do {
        uVar6 = uVar10;
        pwVar8 = pwVar4;
        uVar15 = (ulong)uVar6;
        wVar14 = (pData + lVar17)[lVar3 + 1];
        lVar3 = lVar3 + 1;
        pwVar4 = pwVar8 + 1;
        uVar10 = uVar6 + 1;
      } while ((uint)wVar14 < uVar1);
      uVar13 = uVar7 & 0xffffffff;
      uVar7 = uVar13 + lVar3;
      uVar12 = (long)(int)uVar11;
      do {
        lVar9 = uVar12 - 1;
        uVar11 = uVar12 - 1;
        if (l_00 + 1 == (int)uVar12) break;
        uVar12 = uVar11;
      } while (uVar1 < (uint)pData[lVar9]);
      iVar2 = (int)lVar3;
      if (lVar17 + lVar3 < (long)uVar11) {
        pData[lVar17 + lVar3] = pData[lVar9];
        pData[uVar11] = wVar14;
        if ((uint)pData[lVar17 + lVar3] == uVar1) {
          lVar9 = (long)(int)local_58;
          local_58 = local_58 + 1;
          wVar14 = pData[lVar9 + 1];
          pData[lVar9 + 1] = pData[lVar17 + lVar3];
          pData[lVar17 + lVar3] = wVar14;
          wVar14 = pData[uVar11];
        }
        if ((uint)wVar14 == uVar1) {
          lVar3 = (long)local_5c;
          local_5c = local_5c + -1;
          pData[uVar11] = pData[lVar3 + -1];
          pData[lVar3 + -1] = wVar14;
          uVar7 = (ulong)(uint)(iVar5 + iVar2);
        }
        goto LAB_0049cc08;
      }
      pData[lVar17 + lVar3] = pData[lVar16];
      pData[lVar16] = wVar14;
      if (l_00 < (int)local_58) {
        lVar17 = (long)l_00;
        lVar9 = 0;
        do {
          wVar14 = pData[lVar17 + lVar9];
          pData[lVar17 + lVar9] = *pwVar8;
          *pwVar8 = wVar14;
          pwVar8 = pwVar8 + -1;
          lVar9 = lVar9 + 1;
        } while ((int)local_58 - lVar17 != lVar9);
        iVar2 = ~(uint)lVar9 + iVar5 + iVar2;
      }
      else {
        iVar2 = iVar5 + -1 + iVar2;
      }
      if (local_5c < r + -1) {
        pwVar4 = pData + (int)uVar6;
        lVar3 = lVar16 + -1;
        do {
          wVar14 = *pwVar4;
          *pwVar4 = pData[lVar3];
          pData[lVar3] = wVar14;
          lVar3 = lVar3 + -1;
          pwVar4 = pwVar4 + 1;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (local_5c < lVar3);
      }
      else {
        uVar15 = uVar13 + lVar3 + 1;
      }
      Abc_QuickSort3Inc_rec(pData,l_00,iVar2);
      uVar7 = uVar15 & 0xffffffff;
    } while ((int)uVar15 < r);
  }
  return;
}

Assistant:

void Abc_QuickSort3Inc_rec( word * pData, int l, int r )
{
    word v = pData[r];
    int k, i = l-1, j = r, p = l-1, q = r;
    if ( l >= r )
        return;
    assert( l < r );
    if ( r - l < 10 )
    {
        Abc_SelectSortInc( pData + l, r - l + 1 );
        return;
    }
    while ( 1 )
    {
        while ( (unsigned)pData[++i] < (unsigned)v );
        while ( (unsigned)v < (unsigned)pData[--j] )
            if ( j == l )
                break;
        if ( i >= j )
            break;
        ABC_SWAP( word, pData[i], pData[j] );
        if ( (unsigned)pData[i] == (unsigned)v ) 
            { p++; ABC_SWAP( word, pData[p], pData[i] ); }
        if ( (unsigned)v == (unsigned)pData[j] ) 
            { q--; ABC_SWAP( word, pData[j], pData[q] ); }
    }
    ABC_SWAP( word, pData[i], pData[r] ); 
    j = i-1; i = i+1;
    for ( k = l; k < p; k++, j-- ) 
        ABC_SWAP( word, pData[k], pData[j] );
    for ( k = r-1; k > q; k--, i++ ) 
        ABC_SWAP( word, pData[i], pData[k] );
    Abc_QuickSort3Inc_rec( pData, l, j );
    Abc_QuickSort3Inc_rec( pData, i, r );
}